

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::register_custom_layer(Net *this,char *type,layer_creator_func creator)

{
  pointer *pplVar1;
  iterator __position;
  pointer plVar2;
  int iVar3;
  int iVar4;
  layer_registry_entry entry;
  layer_registry_entry local_38;
  
  iVar3 = layer_to_index(type);
  if (iVar3 == -1) {
    iVar4 = custom_layer_to_index(this,type);
    if (iVar4 == -1) {
      __position._M_current =
           (this->custom_layer_registry).
           super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->custom_layer_registry).
          super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38.name = type;
        local_38.creator = creator;
        std::vector<ncnn::layer_registry_entry,std::allocator<ncnn::layer_registry_entry>>::
        _M_realloc_insert<ncnn::layer_registry_entry_const&>
                  ((vector<ncnn::layer_registry_entry,std::allocator<ncnn::layer_registry_entry>> *)
                   &this->custom_layer_registry,__position,&local_38);
      }
      else {
        (__position._M_current)->name = type;
        (__position._M_current)->creator = creator;
        pplVar1 = &(this->custom_layer_registry).
                   super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      fprintf(_stderr,"overwrite existing custom layer type %s\n",type);
      plVar2 = (this->custom_layer_registry).
               super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar2[iVar4].name = type;
      plVar2[iVar4].creator = creator;
    }
  }
  else {
    fprintf(_stderr,"can not register build-in layer type %s\n",type);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        fprintf(stderr, "can not register build-in layer type %s\n", type);
        return -1;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct layer_registry_entry entry = { type, creator };
        custom_layer_registry.push_back(entry);
    }
    else
    {
        fprintf(stderr, "overwrite existing custom layer type %s\n", type);
        custom_layer_registry[custom_index].name = type;
        custom_layer_registry[custom_index].creator = creator;
    }

    return 0;
}